

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O0

Matrix<double,__1,__1> __thiscall Matrix<double,_-1,_-1>::Zero(Matrix<double,__1,__1> *this)

{
  int iVar1;
  undefined4 local_28;
  undefined4 local_24;
  int j;
  int i;
  Matrix<double,__1,__1> *this_local;
  
  local_24 = 0;
  while( true ) {
    iVar1 = row(this);
    if (iVar1 <= local_24) break;
    local_28 = 0;
    while( true ) {
      iVar1 = col(this);
      if (iVar1 <= local_28) break;
      SetElement(this,local_24,local_28,0.0);
      local_28 = local_28 + 1;
    }
    local_24 = local_24 + 1;
  }
  return *this;
}

Assistant:

Matrix<Type, _0, _1> Matrix<Type, _0, _1>::Zero()
{
    // 这样的实现方法会导致过多占用内存
    // 故不使用静态成员的方法实现
    // 2020 09 10
    // Matrix<Type, _0, _1> Zero;

    // 2020 09 11 
    // 恢复使用静态方法  问题已解决
    // Matrix<Type, _0, _1> Zero_;
    for (int i = 0; i < this->row(); ++i)
        for(int j = 0; j < this->col(); ++j)
            this->SetElement(i, j, 0);
    return (*this);
}